

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTriangleShape.h
# Opt level: O1

bool __thiscall btTriangleShape::isInside(btTriangleShape *this,btVector3 *pt,btScalar tolerance)

{
  uint uVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar5;
  float fVar6;
  btVector3 pa;
  btVector3 normal;
  btVector3 pb;
  float local_88;
  float local_84;
  float local_80;
  undefined1 local_78 [16];
  btVector3 local_68;
  float local_58;
  float local_54;
  float local_50;
  undefined1 local_48 [16];
  float local_38;
  uint uStack_34;
  uint uStack_30;
  uint uStack_2c;
  
  local_78._4_4_ = in_XMM0_Db;
  local_78._0_4_ = tolerance;
  local_78._8_4_ = in_XMM0_Dc;
  local_78._12_4_ = in_XMM0_Dd;
  calcNormal(this,&local_68);
  fVar3 = (local_68.m_floats[2] * pt->m_floats[2] +
          local_68.m_floats[0] * pt->m_floats[0] + pt->m_floats[1] * local_68.m_floats[1]) -
          (local_68.m_floats[2] * this->m_vertices1[0].m_floats[2] +
          local_68.m_floats[0] * this->m_vertices1[0].m_floats[0] +
          this->m_vertices1[0].m_floats[1] * local_68.m_floats[1]);
  local_38 = -(float)local_78._0_4_;
  uStack_34 = local_78._4_4_ ^ 0x80000000;
  uStack_30 = local_78._8_4_ ^ 0x80000000;
  uStack_2c = local_78._12_4_ ^ 0x80000000;
  bVar2 = false;
  if ((local_38 <= fVar3) && (bVar2 = false, fVar3 <= (float)local_78._0_4_)) {
    uVar1 = 0xffffffff;
    do {
      uVar1 = uVar1 + 1;
      (*(this->super_btPolyhedralConvexShape).super_btConvexInternalShape.super_btConvexShape.
        super_btCollisionShape._vptr_btCollisionShape[0x1a])(this,(ulong)uVar1,&local_88,&local_58);
      fVar3 = (local_54 - local_84) * local_68.m_floats[2] -
              local_68.m_floats[1] * (local_50 - local_80);
      fVar6 = (local_50 - local_80) * local_68.m_floats[0] -
              local_68.m_floats[2] * (local_58 - local_88);
      fVar5 = (local_58 - local_88) * local_68.m_floats[1] -
              (local_54 - local_84) * local_68.m_floats[0];
      fVar4 = fVar5 * fVar5 + fVar3 * fVar3 + fVar6 * fVar6;
      if (fVar4 < 0.0) {
        local_78 = ZEXT416((uint)fVar3);
        local_48 = ZEXT416((uint)fVar6);
        fVar4 = sqrtf(fVar4);
        fVar3 = (float)local_78._0_4_;
        fVar6 = (float)local_48._0_4_;
      }
      else {
        fVar4 = SQRT(fVar4);
      }
      fVar4 = 1.0 / fVar4;
      if ((fVar4 * fVar5 * pt->m_floats[2] +
          fVar3 * fVar4 * pt->m_floats[0] + fVar6 * fVar4 * pt->m_floats[1]) -
          (fVar4 * fVar5 * local_80 + fVar3 * fVar4 * local_88 + fVar6 * fVar4 * local_84) <
          local_38) {
        return false;
      }
      bVar2 = 1 < uVar1;
    } while (uVar1 != 2);
  }
  return bVar2;
}

Assistant:

virtual	bool isInside(const btVector3& pt,btScalar tolerance) const
	{
		btVector3 normal;
		calcNormal(normal);
		//distance to plane
		btScalar dist = pt.dot(normal);
		btScalar planeconst = m_vertices1[0].dot(normal);
		dist -= planeconst;
		if (dist >= -tolerance && dist <= tolerance)
		{
			//inside check on edge-planes
			int i;
			for (i=0;i<3;i++)
			{
				btVector3 pa,pb;
				getEdge(i,pa,pb);
				btVector3 edge = pb-pa;
				btVector3 edgeNormal = edge.cross(normal);
				edgeNormal.normalize();
				btScalar dist = pt.dot( edgeNormal);
				btScalar edgeConst = pa.dot(edgeNormal);
				dist -= edgeConst;
				if (dist < -tolerance)
					return false;
			}
			
			return true;
		}

		return false;
	}